

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

void __thiscall Input::Input(Input *this)

{
  this->mouseX = 0.0;
  this->mouseY = 0.0;
  memset(this,0,0x429);
  return;
}

Assistant:

Input::Input()
{
	for (unsigned int i = 0; i< GLFW_KEY_LAST; i++)
	{
		keys[i] = false;
		keysUp[i] = false;
		keysDown[i] = false;
	}
	for (unsigned int i = 0; i< GLFW_MOUSE_BUTTON_LAST; i++)
	{
		mouse[i] = false;
		mouseUp[i] = false;
		mouseDown[i] = false;
	}
	
	mouseX = 0;
	mouseY = 0;
}